

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jobs.cpp
# Opt level: O1

void __thiscall JsUtil::JobProcessor::PrioritizeManager(JobProcessor *this,JobManager *manager)

{
  Job *first;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *tail;
  Job *last;
  Job *pJVar4;
  
  if (manager == (JobManager *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x109,"(manager)","manager");
    if (!bVar2) goto LAB_00684488;
    *puVar3 = 0;
  }
  if (this->isClosed == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x10a,"(!isClosed)","!isClosed");
    if (!bVar2) {
LAB_00684488:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  DoublyLinkedListElement<JsUtil::JobManager,_Memory::ArenaAllocator>::
  MoveToBeginning<JsUtil::JobManager>(manager,&(this->managers).head,&(this->managers).tail);
  if (manager->numJobsAddedToProcessor != 0) {
    first = (this->jobs).head;
    tail = &(this->jobs).tail;
    last = (Job *)0x0;
    pJVar4 = (Job *)tail;
    do {
      pJVar4 = (pJVar4->super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>).previous
      ;
      if (pJVar4 == (Job *)0x0) break;
      if (pJVar4->manager == manager) {
        if (last == (Job *)0x0) {
          last = pJVar4;
        }
      }
      else {
        if (last != (Job *)0x0) {
          DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>::
          MoveSubsequenceToBeginning<JsUtil::Job>
                    ((pJVar4->super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>).
                     next,last,&(this->jobs).head,tail);
        }
        last = (Job *)0x0;
      }
    } while (pJVar4 != first);
    if (last != (Job *)0x0) {
      DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>::
      MoveSubsequenceToBeginning<JsUtil::Job>(first,last,&(this->jobs).head,tail);
      return;
    }
  }
  return;
}

Assistant:

void JobProcessor::PrioritizeManager(JobManager *const manager)
    {
        Assert(manager);
        Assert(!isClosed);

        managers.MoveToBeginning(manager);
        if (manager->numJobsAddedToProcessor == 0)
        {
            return;
        }

        // Move this manager's jobs to the beginning too. Find sequences of this manager's jobs backwards so that their relative
        // order remains intact after the sequences are moved.
        Job *const originalHead = jobs.Head();
        Job *lastJob = 0;
        for (Job *job = jobs.Tail(); job; job = job->Previous())
        {
            if (job->Manager() == manager)
            {
                if (!lastJob)
                    lastJob = job;
            }
            else if (lastJob)
            {
                jobs.MoveSubsequenceToBeginning(job->Next(), lastJob);
                lastJob = 0;
            }

            if (job == originalHead)
            {
                break;
            }
        }
        if (lastJob)
        {
            jobs.MoveSubsequenceToBeginning(originalHead, lastJob);
        }
    }